

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
llvm::
DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::grow(DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
       *this,uint AtLeast)

{
  uint uVar1;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *OldBucketsBegin;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = this->NumBuckets;
  OldBucketsBegin = this->Buckets;
  uVar3 = AtLeast - 1 >> 1 | AtLeast - 1;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar3 = (uVar3 >> 0x10 | uVar3) + 1;
  uVar4 = 0x40;
  if (0x40 < uVar3) {
    uVar4 = (ulong)uVar3;
  }
  this->NumBuckets = (uint)uVar4;
  pDVar2 = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)operator_new(uVar4 << 4);
  this->Buckets = pDVar2;
  if (OldBucketsBegin != (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0) {
    DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
    ::moveFromOldBuckets
              ((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                *)this,OldBucketsBegin,OldBucketsBegin + uVar1);
    operator_delete(OldBucketsBegin);
    return;
  }
  DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
  ::initEmpty((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
               *)this);
  return;
}

Assistant:

void grow(unsigned AtLeast) {
    unsigned OldNumBuckets = NumBuckets;
    BucketT *OldBuckets = Buckets;

    allocateBuckets(std::max<unsigned>(64, static_cast<unsigned>(NextPowerOf2(AtLeast-1))));
    assert(Buckets);
    if (!OldBuckets) {
      this->BaseT::initEmpty();
      return;
    }

    this->moveFromOldBuckets(OldBuckets, OldBuckets+OldNumBuckets);

    // Free the old table.
    operator delete(OldBuckets);
  }